

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

String * __thiscall
capnp::compiler::CompilerMain::readOneText
          (String *__return_storage_ptr__,CompilerMain *this,BufferedInputStreamWrapper *input)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  RemoveConst<char> *pRVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar7;
  size_t __n;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  int iVar11;
  Vector<char> chars;
  Vector<char> local_68;
  BufferedInputStreamWrapper *local_40;
  String *local_38;
  char *__src;
  
  local_68.builder.ptr = (char *)0x0;
  local_68.builder.pos = (char *)0x0;
  local_68.builder.endPtr = (char *)0x0;
  local_68.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  bVar2 = 0;
  iVar11 = 0;
  bVar3 = false;
  local_40 = input;
  local_38 = __return_storage_ptr__;
  do {
    iVar6 = (*(local_40->super_BufferedInputStream).super_InputStream._vptr_InputStream[4])();
    __src = (char *)CONCAT44(extraout_var,iVar6);
    if (__n == 0) {
      if (local_68.builder.pos == local_68.builder.endPtr) {
        sVar10 = 4;
        if (local_68.builder.pos != local_68.builder.ptr) {
          sVar10 = ((long)local_68.builder.pos - (long)local_68.builder.ptr) * 2;
        }
        kj::Vector<char>::setCapacity(&local_68,sVar10);
      }
      *local_68.builder.pos = '\0';
      local_68.builder.pos = local_68.builder.pos + 1;
      if (local_68.builder.pos != local_68.builder.endPtr) {
        kj::Vector<char>::setCapacity
                  (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
      }
LAB_001215d1:
      (local_38->content).ptr = local_68.builder.ptr;
      (local_38->content).size_ = (long)local_68.builder.pos - (long)local_68.builder.ptr;
      (local_38->content).disposer = local_68.builder.disposer;
      return local_38;
    }
    lVar8 = 0;
    pcVar7 = __src;
    do {
      cVar1 = *pcVar7;
      if (bVar3) {
        bVar3 = cVar1 != '\n';
      }
      else {
        bVar4 = false;
        bVar3 = false;
        if (cVar1 == ')') {
          if (iVar11 == 0) {
            iVar11 = 0;
          }
          else {
            iVar11 = iVar11 + -1;
            bVar2 = bVar2 | iVar11 == 0;
            bVar3 = bVar4;
          }
        }
        else if (cVar1 == '(') {
          if ((bool)(iVar11 == 0 & bVar2)) {
            pcVar7 = local_68.builder.pos + (-lVar8 - (long)local_68.builder.ptr);
            if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar7) {
              pcVar9 = (char *)0x4;
              if (local_68.builder.endPtr != local_68.builder.ptr) {
                pcVar9 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2)
                ;
              }
              if (pcVar9 < pcVar7) {
                pcVar9 = pcVar7;
              }
              kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar9);
            }
            pRVar5 = local_68.builder.pos;
            if (lVar8 != 0) {
              memcpy(local_68.builder.pos,__src,-lVar8);
              local_68.builder.pos = pRVar5 + -lVar8;
            }
            if (local_68.builder.pos == local_68.builder.endPtr) {
              sVar10 = 4;
              if (local_68.builder.pos != local_68.builder.ptr) {
                sVar10 = ((long)local_68.builder.pos - (long)local_68.builder.ptr) * 2;
              }
              kj::Vector<char>::setCapacity(&local_68,sVar10);
            }
            *local_68.builder.pos = '\0';
            local_68.builder.pos = local_68.builder.pos + 1;
            (*(local_40->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])
                      (local_40,-lVar8);
            if (local_68.builder.pos != local_68.builder.endPtr) {
              kj::Vector<char>::setCapacity
                        (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
            }
            goto LAB_001215d1;
          }
          iVar11 = iVar11 + 1;
          bVar3 = bVar4;
        }
        else {
          bVar3 = bVar4;
          if (cVar1 == '#') {
            bVar3 = true;
          }
        }
      }
      lVar8 = lVar8 + -1;
      pcVar7 = pcVar7 + 1;
    } while (__n + lVar8 != 0);
    pcVar7 = local_68.builder.pos + (__n - (long)local_68.builder.ptr);
    if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar7) {
      pcVar9 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
      if (local_68.builder.endPtr == local_68.builder.ptr) {
        pcVar9 = (char *)0x4;
      }
      if (pcVar9 < pcVar7) {
        pcVar9 = pcVar7;
      }
      kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar9);
    }
    pRVar5 = local_68.builder.pos;
    memcpy(local_68.builder.pos,__src,__n);
    local_68.builder.pos = pRVar5 + __n;
    (*(local_40->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])(local_40,__n);
  } while( true );
}

Assistant:

kj::String readOneText(kj::BufferedInputStreamWrapper& input) {
    // Consume and return one parentheses-delimited message from the input.
    //
    // Accounts for nested parentheses, comments, and string literals.

    enum {
      NORMAL,
      COMMENT,
      QUOTE,
      QUOTE_ESCAPE,
      DQUOTE,
      DQUOTE_ESCAPE
    } state = NORMAL;
    uint depth = 0;
    bool sawClose = false;

    kj::Vector<char> chars;

    for (;;) {
      auto buffer = input.tryGetReadBuffer();

      if (buffer == nullptr) {
        // EOF
        chars.add('\0');
        return kj::String(chars.releaseAsArray());
      }

      for (auto i: kj::indices(buffer)) {
        char c = buffer[i];
        switch (state) {
          case NORMAL:
            switch (c) {
              case '#': state = COMMENT; break;
              case '(':
                if (depth == 0 && sawClose) {
                  // We already got one complete message. This is the start of the next message.
                  // Stop here.
                  chars.addAll(buffer.first(i));
                  chars.add('\0');
                  input.skip(i);
                  return kj::String(chars.releaseAsArray());
                }
                ++depth;
                break;
              case ')':
                if (depth > 0) {
                  if (--depth == 0) {
                    sawClose = true;
                  }
                }
                break;
              default: break;
            }
            break;
          case COMMENT:
            switch (c) {
              case '\n': state = NORMAL; break;
              default: break;
            }
            break;
          case QUOTE:
            switch (c) {
              case '\'': state = NORMAL; break;
              case '\\': state = QUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case QUOTE_ESCAPE:
            break;
          case DQUOTE:
            switch (c) {
              case '\"': state = NORMAL; break;
              case '\\': state = DQUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case DQUOTE_ESCAPE:
            break;
        }
      }

      chars.addAll(buffer);
      input.skip(buffer.size());
    }
  }